

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIDFontWriter.cpp
# Opt level: O0

EStatusCode __thiscall
CIDFontWriter::WriteToUnicodeMap(CIDFontWriter *this,ObjectIDType inToUnicodeMap)

{
  unsigned_short uVar1;
  char *pcVar2;
  PrimitiveObjectsWriter PVar3;
  bool bVar4;
  Trace *this_00;
  PDFStream *this_01;
  size_type sVar5;
  size_t sVar6;
  pointer ppVar7;
  __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
  local_c8;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  ulong local_60;
  unsigned_long vectorSize;
  __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
  local_50;
  iterator it;
  unsigned_long i;
  PrimitiveObjectsWriter primitiveWriter;
  IByteWriter *cmapWriteContext;
  PDFStream *pdfStream;
  EStatusCode status;
  ObjectIDType inToUnicodeMap_local;
  CIDFontWriter *this_local;
  
  this_local._4_4_ = ObjectsContext::StartNewIndirectObject(this->mObjectsContext,inToUnicodeMap);
  if (this_local._4_4_ == eSuccess) {
    this_01 = ObjectsContext::StartPDFStream(this->mObjectsContext,(DictionaryContext *)0x0,false);
    primitiveWriter.mStreamForWriting = PDFStream::GetWriteStream(this_01);
    PrimitiveObjectsWriter::PrimitiveObjectsWriter
              ((PrimitiveObjectsWriter *)&i,primitiveWriter.mStreamForWriting);
    it._M_current = (pair<unsigned_int,_GlyphEncodingInfo> *)0x1;
    vectorSize = (unsigned_long)
                 std::
                 vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                 ::begin(&this->mCharactersVector);
    local_50 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
               ::operator+((__normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
                            *)&vectorSize,1);
    sVar5 = std::
            vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
            ::size(&this->mCharactersVector);
    PVar3 = primitiveWriter;
    pcVar2 = scCmapHeader;
    local_60 = sVar5 - 1;
    sVar6 = strlen(scCmapHeader);
    (*(PVar3.mStreamForWriting)->_vptr_IByteWriter[2])(PVar3.mStreamForWriting,pcVar2,sVar6);
    pcVar2 = scFourByteRangeStart;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar2,&local_91);
    PrimitiveObjectsWriter::WriteEncodedHexString
              ((PrimitiveObjectsWriter *)&i,&local_90,eTokenSeparatorSpace);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    pcVar2 = scFourByteRangeEnd;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar2,&local_b9);
    PrimitiveObjectsWriter::WriteEncodedHexString
              ((PrimitiveObjectsWriter *)&i,&local_b8,eTokenSeparatorEndLine);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    PVar3 = primitiveWriter;
    pcVar2 = scEndCodeSpaceRange;
    sVar6 = strlen(scEndCodeSpaceRange);
    (*(PVar3.mStreamForWriting)->_vptr_IByteWriter[2])(PVar3.mStreamForWriting,pcVar2,sVar6);
    if (local_60 < 100) {
      PrimitiveObjectsWriter::WriteInteger
                ((PrimitiveObjectsWriter *)&i,local_60,eTokenSeparatorSpace);
    }
    else {
      PrimitiveObjectsWriter::WriteInteger((PrimitiveObjectsWriter *)&i,100,eTokenSeparatorSpace);
    }
    PrimitiveObjectsWriter::WriteKeyword((PrimitiveObjectsWriter *)&i,&scBeginBFChar_abi_cxx11_);
    PVar3 = primitiveWriter;
    ppVar7 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
             ::operator->(&local_50);
    uVar1 = (ppVar7->second).mEncodedCharacter;
    ppVar7 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
             ::operator->(&local_50);
    WriteGlyphEntry(this,PVar3.mStreamForWriting,uVar1,&(ppVar7->second).mUnicodeCharacters);
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
    ::operator++(&local_50);
    while( true ) {
      local_c8._M_current =
           (pair<unsigned_int,_GlyphEncodingInfo> *)
           std::
           vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
           ::end(&this->mCharactersVector);
      bVar4 = __gnu_cxx::operator!=(&local_50,&local_c8);
      if (!bVar4) break;
      if ((ulong)it._M_current % 100 == 0) {
        PrimitiveObjectsWriter::WriteKeyword((PrimitiveObjectsWriter *)&i,&scEndBFChar_abi_cxx11_);
        if (local_60 - (long)it._M_current < 100) {
          PrimitiveObjectsWriter::WriteInteger
                    ((PrimitiveObjectsWriter *)&i,local_60 - (long)it._M_current,
                     eTokenSeparatorSpace);
        }
        else {
          PrimitiveObjectsWriter::WriteInteger
                    ((PrimitiveObjectsWriter *)&i,100,eTokenSeparatorSpace);
        }
        PrimitiveObjectsWriter::WriteKeyword((PrimitiveObjectsWriter *)&i,&scBeginBFChar_abi_cxx11_)
        ;
      }
      PVar3.mStreamForWriting = primitiveWriter.mStreamForWriting;
      ppVar7 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
               ::operator->(&local_50);
      uVar1 = (ppVar7->second).mEncodedCharacter;
      ppVar7 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
               ::operator->(&local_50);
      WriteGlyphEntry(this,PVar3.mStreamForWriting,uVar1,&(ppVar7->second).mUnicodeCharacters);
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_int,_GlyphEncodingInfo>_*,_std::vector<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>_>
      ::operator++(&local_50);
      it._M_current = (pair<unsigned_int,_GlyphEncodingInfo> *)((long)&(it._M_current)->first + 1);
    }
    PrimitiveObjectsWriter::WriteKeyword((PrimitiveObjectsWriter *)&i,&scEndBFChar_abi_cxx11_);
    PVar3 = primitiveWriter;
    pcVar2 = scCmapFooter;
    sVar6 = strlen(scCmapFooter);
    (*(PVar3.mStreamForWriting)->_vptr_IByteWriter[2])(PVar3.mStreamForWriting,pcVar2,sVar6);
    this_local._4_4_ = ObjectsContext::EndPDFStream(this->mObjectsContext,this_01);
    if (this_01 != (PDFStream *)0x0) {
      PDFStream::~PDFStream(this_01);
      operator_delete(this_01,0xf0);
    }
    PrimitiveObjectsWriter::~PrimitiveObjectsWriter((PrimitiveObjectsWriter *)&i);
  }
  else {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "CIDFontWriter::WriteToUnicodeMap, could not write to unicode map object %ld",
                      inToUnicodeMap);
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode CIDFontWriter::WriteToUnicodeMap(ObjectIDType inToUnicodeMap)
{
	EStatusCode status = mObjectsContext->StartNewIndirectObject(inToUnicodeMap);
	if(status != eSuccess)
	{
		TRACE_LOG1("CIDFontWriter::WriteToUnicodeMap, could not write to unicode map object %ld",inToUnicodeMap);
		return status;
	}
	PDFStream* pdfStream = mObjectsContext->StartPDFStream();
	IByteWriter* cmapWriteContext = pdfStream->GetWriteStream();
	PrimitiveObjectsWriter primitiveWriter(cmapWriteContext);
	unsigned long i = 1;
	UIntAndGlyphEncodingInfoVector::iterator it = mCharactersVector.begin() + 1; // skip 0 glyph
	unsigned long vectorSize = (unsigned long)mCharactersVector.size() - 1; // cause 0 is not there

	cmapWriteContext->Write((const Byte*)scCmapHeader,strlen(scCmapHeader));
	primitiveWriter.WriteEncodedHexString(scFourByteRangeStart);
	primitiveWriter.WriteEncodedHexString(scFourByteRangeEnd,eTokenSeparatorEndLine);
	cmapWriteContext->Write((const Byte*)scEndCodeSpaceRange,strlen(scEndCodeSpaceRange));

	if(vectorSize < 100)
		primitiveWriter.WriteInteger(vectorSize);
	else
		primitiveWriter.WriteInteger(100);
	primitiveWriter.WriteKeyword(scBeginBFChar);
	
	WriteGlyphEntry(cmapWriteContext,it->second.mEncodedCharacter,it->second.mUnicodeCharacters);
	++it;
	for(; it != mCharactersVector.end(); ++it,++i)
	{
		if(i % 100 == 0)
		{
			primitiveWriter.WriteKeyword(scEndBFChar);
			if(vectorSize - i < 100)
				primitiveWriter.WriteInteger(vectorSize - i);
			else
				primitiveWriter.WriteInteger(100);
			primitiveWriter.WriteKeyword(scBeginBFChar);
		}
		WriteGlyphEntry(cmapWriteContext,it->second.mEncodedCharacter,it->second.mUnicodeCharacters);
	}
	primitiveWriter.WriteKeyword(scEndBFChar);
	cmapWriteContext->Write((const Byte*)scCmapFooter,strlen(scCmapFooter));
	status = mObjectsContext->EndPDFStream(pdfStream);
	delete pdfStream;
	return status;
}